

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode Curl_add_custom_headers(Curl_easy *data,_Bool is_connect,dynbuf *req)

{
  char cVar1;
  connectdata *pcVar2;
  curl_slist *pcVar3;
  uchar uVar4;
  _Bool _Var5;
  int iVar6;
  CURLcode CVar7;
  char *pcVar8;
  char *pcVar9;
  long lVar10;
  undefined7 in_register_00000031;
  curl_slist **ppcVar11;
  char *__s;
  char *pcVar12;
  long local_60;
  curl_slist *h [2];
  
  pcVar2 = data->conn;
  local_60 = 1;
  if ((int)CONCAT71(in_register_00000031,is_connect) == 0) {
    h[0] = (data->set).headers;
    if ((((ulong)pcVar2->bits & 9) == 1) && (((data->set).field_0x8ca & 8) != 0)) {
      h[1] = (data->set).proxyheaders;
      local_60 = 2;
    }
  }
  else {
    if (((data->set).field_0x8ca & 8) == 0) {
      h[0] = (data->set).headers;
    }
    else {
      h[0] = (data->set).proxyheaders;
    }
  }
  lVar10 = 0;
  do {
    if (lVar10 == local_60) {
      return CURLE_OK;
    }
    ppcVar11 = h + lVar10;
LAB_00131618:
    pcVar3 = *ppcVar11;
    if (pcVar3 != (curl_slist *)0x0) {
      __s = pcVar3->data;
      pcVar8 = strchr(__s,0x3a);
      if (pcVar8 != (char *)0x0) goto LAB_0013163c;
      pcVar8 = strchr(__s,0x3b);
      pcVar12 = pcVar8;
      pcVar9 = pcVar8;
      if (pcVar8 != (char *)0x0) {
        do {
          cVar1 = pcVar9[1];
          if ((cVar1 != '\t') && (cVar1 != ' ')) {
            if (cVar1 == '\0') goto LAB_0013180a;
            if (3 < (byte)(cVar1 - 10U)) goto LAB_001317fd;
          }
          pcVar12 = pcVar12 + 1;
          pcVar9 = pcVar9 + 1;
        } while( true );
      }
      goto LAB_00131801;
    }
    lVar10 = lVar10 + 1;
  } while( true );
LAB_001317fd:
  if (cVar1 != '\0') goto LAB_00131801;
LAB_0013180a:
  if (*pcVar9 == ';') {
    pcVar9 = (*Curl_cstrdup)(__s);
    if (pcVar9 == (char *)0x0) {
      Curl_dyn_free(req);
      return CURLE_OUT_OF_MEMORY;
    }
    pcVar12[(long)pcVar9 - (long)pcVar3->data] = ':';
    __s = pcVar3->data;
    pcVar8 = pcVar12 + ((long)pcVar9 - (long)__s);
  }
  else {
LAB_0013163c:
    pcVar9 = (char *)0x0;
  }
  if (pcVar8 == __s) goto LAB_00131801;
  do {
    do {
      pcVar8 = pcVar8 + 1;
      cVar1 = *pcVar8;
    } while (cVar1 == '\t');
  } while ((cVar1 == ' ') || ((cVar1 != '\0' && ((byte)(cVar1 - 10U) < 4))));
  if ((pcVar9 == (char *)0x0) && (cVar1 == '\0')) goto LAB_00131801;
  if (pcVar9 != (char *)0x0) {
    __s = pcVar9;
  }
  if (((data->state).aptr.host == (char *)0x0) ||
     (iVar6 = curl_strnequal(__s,"Host:",5), iVar6 == 0)) {
    uVar4 = (data->state).httpreq;
    if (uVar4 == '\x02') {
      iVar6 = curl_strnequal(__s,"Content-Type:",0xd);
      if (iVar6 != 0) goto LAB_001317e2;
      uVar4 = (data->state).httpreq;
    }
    if ((((((uVar4 == '\x03') && (iVar6 = curl_strnequal(__s,"Content-Type:",0xd), iVar6 != 0)) ||
          ((((data->req).field_0xdb & 4) != 0 &&
           (iVar6 = curl_strnequal(__s,"Content-Length:",0xf), iVar6 != 0)))) ||
         (((data->state).aptr.te != (char *)0x0 &&
          (iVar6 = curl_strnequal(__s,"Connection:",0xb), iVar6 != 0)))) ||
        ((0x13 < pcVar2->httpversion &&
         (iVar6 = curl_strnequal(__s,"Transfer-Encoding:",0x12), iVar6 != 0)))) ||
       (((iVar6 = curl_strnequal(__s,"Authorization:",0xe), iVar6 != 0 ||
         (iVar6 = curl_strnequal(__s,"Cookie:",7), iVar6 != 0)) &&
        (_Var5 = Curl_auth_allowed_to_host(data), !_Var5)))) goto LAB_001317e2;
    CVar7 = Curl_dyn_addf(req,"%s\r\n",__s);
  }
  else {
LAB_001317e2:
    CVar7 = CURLE_OK;
  }
  if (pcVar9 != (char *)0x0) {
    (*Curl_cfree)(pcVar9);
  }
  if (CVar7 != CURLE_OK) {
    return CVar7;
  }
LAB_00131801:
  ppcVar11 = &pcVar3->next;
  goto LAB_00131618;
}

Assistant:

CURLcode Curl_add_custom_headers(struct Curl_easy *data,
                                 bool is_connect,
#ifndef USE_HYPER
                                 struct dynbuf *req
#else
                                 void *req
#endif
  )
{
  struct connectdata *conn = data->conn;
  char *ptr;
  struct curl_slist *h[2];
  struct curl_slist *headers;
  int numlists = 1; /* by default */
  int i;

#ifndef CURL_DISABLE_PROXY
  enum proxy_use proxy;

  if(is_connect)
    proxy = HEADER_CONNECT;
  else
    proxy = conn->bits.httpproxy && !conn->bits.tunnel_proxy?
      HEADER_PROXY:HEADER_SERVER;

  switch(proxy) {
  case HEADER_SERVER:
    h[0] = data->set.headers;
    break;
  case HEADER_PROXY:
    h[0] = data->set.headers;
    if(data->set.sep_headers) {
      h[1] = data->set.proxyheaders;
      numlists++;
    }
    break;
  case HEADER_CONNECT:
    if(data->set.sep_headers)
      h[0] = data->set.proxyheaders;
    else
      h[0] = data->set.headers;
    break;
  }
#else
  (void)is_connect;
  h[0] = data->set.headers;
#endif

  /* loop through one or two lists */
  for(i = 0; i < numlists; i++) {
    headers = h[i];

    while(headers) {
      char *semicolonp = NULL;
      ptr = strchr(headers->data, ':');
      if(!ptr) {
        char *optr;
        /* no colon, semicolon? */
        ptr = strchr(headers->data, ';');
        if(ptr) {
          optr = ptr;
          ptr++; /* pass the semicolon */
          while(*ptr && ISSPACE(*ptr))
            ptr++;

          if(*ptr) {
            /* this may be used for something else in the future */
            optr = NULL;
          }
          else {
            if(*(--ptr) == ';') {
              /* copy the source */
              semicolonp = strdup(headers->data);
              if(!semicolonp) {
#ifndef USE_HYPER
                Curl_dyn_free(req);
#endif
                return CURLE_OUT_OF_MEMORY;
              }
              /* put a colon where the semicolon is */
              semicolonp[ptr - headers->data] = ':';
              /* point at the colon */
              optr = &semicolonp [ptr - headers->data];
            }
          }
          ptr = optr;
        }
      }
      if(ptr && (ptr != headers->data)) {
        /* we require a colon for this to be a true header */

        ptr++; /* pass the colon */
        while(*ptr && ISSPACE(*ptr))
          ptr++;

        if(*ptr || semicolonp) {
          /* only send this if the contents was non-blank or done special */
          CURLcode result = CURLE_OK;
          char *compare = semicolonp ? semicolonp : headers->data;

          if(data->state.aptr.host &&
             /* a Host: header was sent already, do not pass on any custom
                Host: header as that will produce *two* in the same
                request! */
             checkprefix("Host:", compare))
            ;
          else if(data->state.httpreq == HTTPREQ_POST_FORM &&
                  /* this header (extended by formdata.c) is sent later */
                  checkprefix("Content-Type:", compare))
            ;
          else if(data->state.httpreq == HTTPREQ_POST_MIME &&
                  /* this header is sent later */
                  checkprefix("Content-Type:", compare))
            ;
          else if(data->req.authneg &&
                  /* while doing auth neg, do not allow the custom length since
                     we will force length zero then */
                  checkprefix("Content-Length:", compare))
            ;
          else if(data->state.aptr.te &&
                  /* when asking for Transfer-Encoding, do not pass on a custom
                     Connection: */
                  checkprefix("Connection:", compare))
            ;
          else if((conn->httpversion >= 20) &&
                  checkprefix("Transfer-Encoding:", compare))
            /* HTTP/2 does not support chunked requests */
            ;
          else if((checkprefix("Authorization:", compare) ||
                   checkprefix("Cookie:", compare)) &&
                  /* be careful of sending this potentially sensitive header to
                     other hosts */
                  !Curl_auth_allowed_to_host(data))
            ;
          else {
#ifdef USE_HYPER
            result = Curl_hyper_header(data, req, compare);
#else
            result = Curl_dyn_addf(req, "%s\r\n", compare);
#endif
          }
          if(semicolonp)
            free(semicolonp);
          if(result)
            return result;
        }
      }
      headers = headers->next;
    }
  }

  return CURLE_OK;
}